

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double pareto_variance(double a,double b)

{
  __type _Var1;
  double variance;
  double b_local;
  double a_local;
  
  if (2.0 < b) {
    _Var1 = std::pow<double,int>(b - 1.0,2);
    a_local = (a * a * b) / (_Var1 * (b - 2.0));
  }
  else {
    std::operator<<((ostream *)&std::cout," \n");
    std::operator<<((ostream *)&std::cout,"PARETO_VARIANCE - Warning!\n");
    std::operator<<((ostream *)&std::cout,"  For B <= 2, the variance does not exist.\n");
    a_local = 0.0;
  }
  return a_local;
}

Assistant:

double pareto_variance ( double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    PARETO_VARIANCE returns the variance of the Pareto PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Output, double PARETO_VARIANCE, the variance of the PDF.
//
{
  double variance;

  if ( b <= 2.0 )
  {
    cout << " \n";
    cout << "PARETO_VARIANCE - Warning!\n";
    cout << "  For B <= 2, the variance does not exist.\n";
    variance = 0.0;
    return variance;
  }

  variance = a * a * b / ( pow ( ( b - 1.0 ), 2 ) * ( b - 2.0 ) );

  return variance;
}